

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_add(run_container_t *run,uint16_t pos)

{
  rle16_t *prVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  prVar1 = run->runs;
  iVar5 = run->n_runs;
  if (0 < iVar5) {
    iVar7 = iVar5 + -1;
    uVar2 = 0;
    do {
      uVar4 = (uint)(iVar7 + (int)uVar2) >> 1;
      if (prVar1[uVar4].value < pos) {
        uVar2 = (ulong)(uVar4 + 1);
      }
      else {
        if (prVar1[uVar4].value <= pos) {
          return false;
        }
        iVar7 = uVar4 - 1;
      }
      iVar8 = (int)uVar2;
    } while (iVar8 <= iVar7);
    if (iVar8 != 0) {
      uVar4 = iVar8 - 1;
      iVar7 = (uint)pos - (uint)prVar1[uVar4].value;
      if (iVar7 <= (int)(uint)prVar1[uVar4].length) {
        return false;
      }
      iVar6 = prVar1[uVar4].length + 1;
      if (iVar7 == iVar6) {
        if ((iVar8 < iVar5) && (pos + 1 == (uint)prVar1[uVar2].value)) {
          prVar1[uVar4].length = (prVar1[uVar2].value - prVar1[uVar4].value) + prVar1[uVar2].length;
          uVar2 = uVar2 & 0xffff;
          memmove(prVar1 + uVar2,prVar1 + uVar2 + 1,(long)(int)(iVar5 + ~(uint)uVar2) << 2);
          run->n_runs = run->n_runs + -1;
          return true;
        }
        prVar1[uVar4].length = (uint16_t)iVar6;
        return true;
      }
      if ((iVar8 < iVar5) && (pos + 1 == (uint)prVar1[uVar2].value)) {
        prVar1[uVar2].value = pos;
        prVar1[uVar2].length = prVar1[uVar2].length + 1;
        return true;
      }
      goto LAB_00117038;
    }
    if (pos + 1 == (uint)prVar1->value) {
      prVar1->length = prVar1->length + 1;
      prVar1->value = prVar1->value - 1;
      return true;
    }
  }
  uVar2 = 0;
LAB_00117038:
  if (run->capacity <= iVar5) {
    run_container_grow(run,iVar5 + 1,true);
    iVar5 = run->n_runs;
    prVar1 = run->runs;
  }
  uVar3 = uVar2 & 0xffff;
  memmove(prVar1 + uVar3 + 1,prVar1 + uVar3,(long)(iVar5 - (int)uVar3) << 2);
  run->n_runs = run->n_runs + 1;
  prVar1 = run->runs;
  prVar1[uVar2].value = pos;
  prVar1[uVar2].length = 0;
  return true;
}

Assistant:

bool run_container_add(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return false;  // already there
    index = -index - 2;            // points to preceding value, possibly -1
    if (index >= 0) {              // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return false;  // already there
        if (offset == le + 1) {
            // we may need to fuse
            if (index + 1 < run->n_runs) {
                if (run->runs[index + 1].value == pos + 1) {
                    // indeed fusion is needed
                    run->runs[index].length = run->runs[index + 1].value +
                                              run->runs[index + 1].length -
                                              run->runs[index].value;
                    recoverRoomAtIndex(run, (uint16_t)(index + 1));
                    return true;
                }
            }
            run->runs[index].length++;
            return true;
        }
        if (index + 1 < run->n_runs) {
            // we may need to fuse
            if (run->runs[index + 1].value == pos + 1) {
                // indeed fusion is needed
                run->runs[index + 1].value = pos;
                run->runs[index + 1].length = run->runs[index + 1].length + 1;
                return true;
            }
        }
    }
    if (index == -1) {
        // we may need to extend the first run
        if (0 < run->n_runs) {
            if (run->runs[0].value == pos + 1) {
                run->runs[0].length++;
                run->runs[0].value--;
                return true;
            }
        }
    }
    makeRoomAtIndex(run, (uint16_t)(index + 1));
    run->runs[index + 1].value = pos;
    run->runs[index + 1].length = 0;
    return true;
}